

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O2

void RGBLoop(void)

{
  int j;
  int iVar1;
  uchar uVar2;
  int k;
  int iVar3;
  uchar uVar4;
  uchar uVar5;
  
  iVar1 = 0;
  do {
    if (iVar1 == 3) {
      return;
    }
    for (iVar3 = 0; iVar3 != 0x100; iVar3 = iVar3 + 1) {
      uVar2 = (uchar)iVar3;
      if (iVar1 == 2) {
        uVar5 = '\0';
        uVar4 = '\0';
LAB_00102d5f:
        setAll(uVar5,uVar4,uVar2);
      }
      else {
        if (iVar1 == 1) {
          uVar5 = '\0';
          uVar4 = uVar2;
LAB_00102d53:
          uVar2 = '\0';
          goto LAB_00102d5f;
        }
        if (iVar1 == 0) {
          uVar5 = uVar2;
          uVar4 = '\0';
          goto LAB_00102d53;
        }
      }
      showStrip();
      usleep(3000);
    }
    for (iVar3 = 0xff; -1 < iVar3; iVar3 = iVar3 + -1) {
      uVar2 = (uchar)iVar3;
      if (iVar1 == 2) {
        uVar5 = '\0';
        uVar4 = '\0';
LAB_00102da8:
        setAll(uVar5,uVar4,uVar2);
      }
      else {
        if (iVar1 == 1) {
          uVar5 = '\0';
          uVar4 = uVar2;
LAB_00102d9c:
          uVar2 = '\0';
          goto LAB_00102da8;
        }
        if (iVar1 == 0) {
          uVar5 = uVar2;
          uVar4 = '\0';
          goto LAB_00102d9c;
        }
      }
      showStrip();
      usleep(3000);
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

void RGBLoop() {
    for (int j = 0; j < 3; j++) {
        // Fade IN
        for (int k = 0; k < 256; k++) {
            switch (j) {
                case 0:
                    setAll(k, 0, 0);
                    break;
                case 1:
                    setAll(0, k, 0);
                    break;
                case 2:
                    setAll(0, 0, k);
                    break;
            }
            showStrip();
            delay(3);
        }
        // Fade OUT
        for (int k = 255; k >= 0; k--) {
            switch (j) {
                case 0:
                    setAll(k, 0, 0);
                    break;
                case 1:
                    setAll(0, k, 0);
                    break;
                case 2:
                    setAll(0, 0, k);
                    break;
            }
            showStrip();
            delay(3);
        }
    }
}